

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_all_files(void)

{
  int iVar1;
  log_level_t lVar2;
  char *pcVar3;
  int rc;
  char *filename;
  char local_a8 [4];
  int i;
  char uncompressed [80];
  char compressed [80];
  
  log_trace("test_all_files","\n");
  filename._4_4_ = 0;
  while( true ) {
    if (0xd < filename._4_4_) {
      return;
    }
    log_info("---------------------------------------------------------------------------------------------"
             ,"\n");
    pcVar3 = strrchr(TEST_FILES[filename._4_4_],0x2f);
    strcpy(uncompressed + 0x48,pcVar3 + 1);
    strcat(uncompressed + 0x48,".compressed");
    strcpy(local_a8,pcVar3 + 1);
    strcat(local_a8,".uncompressed");
    iVar1 = adh_compress_file(TEST_FILES[filename._4_4_],uncompressed + 0x48);
    if (iVar1 == 1) break;
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    log_info("---------------","\n");
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    iVar1 = adh_decompress_file(uncompressed + 0x48,local_a8);
    if (iVar1 == 1) {
      return;
    }
    log_info("---------------","\n");
    iVar1 = compare_files(TEST_FILES[filename._4_4_],local_a8);
    if (iVar1 == 1) {
      return;
    }
    filename._4_4_ = filename._4_4_ + 1;
  }
  return;
}

Assistant:

void test_all_files() {
    log_trace("test_all_files", "\n");
    char compressed[MAX_FILE_NAME];
    char uncompressed[MAX_FILE_NAME];

    for(int i=0; i<NUM_TEST_FILES; i++) {
        log_info("---------------------------------------------------------------------------------------------", "\n");
        char * filename = strrchr(TEST_FILES[i], '/') + 1;

        strcpy(compressed, filename);
        strcat(compressed, ".compressed");

        strcpy(uncompressed, filename);
        strcat(uncompressed, ".uncompressed");

        int rc = adh_compress_file(TEST_FILES[i], compressed);
        if(rc == RC_FAIL)
            break;

        if(get_log_level() > LOG_INFO) {
            puts("\n\n\n\n");
        }


        log_info("---------------", "\n");

        if(get_log_level() > LOG_INFO)
            puts("\n\n\n\n");

        rc = adh_decompress_file(compressed, uncompressed);
        if(rc == RC_FAIL)
            break;

        log_info("---------------", "\n");
        rc = compare_files(TEST_FILES[i], uncompressed);
        if(rc == RC_FAIL)
            break;
    }
}